

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O2

bool anon_unknown.dwarf_d9f01::save
               (char *filename,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *cmap)

{
  undefined1 uVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  die local_221;
  ofstream ofs;
  byte abStack_200 [480];
  
  std::ofstream::ofstream(&ofs,filename,_S_out);
  if ((abStack_200[*(long *)(_ofs + -0x18)] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"ofs");
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"permission denied: ");
    std::operator<<(poVar2,filename);
    MeCab::die::~die(&local_221);
  }
  for (p_Var3 = (cmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(cmap->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = (ostream *)std::ostream::operator<<(&ofs,p_Var3[2]._M_color);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar1 = std::ofstream::~ofstream(&ofs);
  return (bool)uVar1;
}

Assistant:

bool save(const char* filename,
          std::map<std::string, int> *cmap) {
  std::ofstream ofs(WPATH(filename));
  CHECK_DIE(ofs) << "permission denied: " << filename;
  for (std::map<std::string, int>::const_iterator it = cmap->begin();
       it != cmap->end(); ++it) {
    ofs << it->second << " " << it->first << std::endl;
  }
  return true;
}